

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::internal::
SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::SchemaValidationContext
          (SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,SchemaValidatorFactoryType *f,ErrorHandlerType *eh,SchemaType *s,uint fl)

{
  uint fl_local;
  SchemaType *s_local;
  ErrorHandlerType *eh_local;
  SchemaValidatorFactoryType *f_local;
  SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  this->factory = f;
  this->error_handler = eh;
  this->schema = s;
  this->flags = fl;
  this->valueSchema = (SchemaType *)0x0;
  this->invalidKeyword = (Ch *)0x0;
  this->invalidCode = kValidateErrorNone;
  this->hasher = (void *)0x0;
  this->arrayElementHashCodes = (void *)0x0;
  this->validators = (ISchemaValidator **)0x0;
  this->validatorCount = 0;
  this->patternPropertiesValidators = (ISchemaValidator **)0x0;
  this->patternPropertiesValidatorCount = 0;
  this->patternPropertiesSchemas = (SchemaType **)0x0;
  this->patternPropertiesSchemaCount = 0;
  this->valuePatternValidatorType = kPatternValidatorOnly;
  this->propertyExist = (bool *)0x0;
  this->inArray = false;
  this->valueUniqueness = false;
  this->arrayUniqueness = false;
  return;
}

Assistant:

SchemaValidationContext(SchemaValidatorFactoryType& f, ErrorHandlerType& eh, const SchemaType* s, unsigned fl = 0) :
        factory(f),
        error_handler(eh),
        schema(s),
        flags(fl),
        valueSchema(),
        invalidKeyword(),
        invalidCode(),
        hasher(),
        arrayElementHashCodes(),
        validators(),
        validatorCount(),
        patternPropertiesValidators(),
        patternPropertiesValidatorCount(),
        patternPropertiesSchemas(),
        patternPropertiesSchemaCount(),
        valuePatternValidatorType(kPatternValidatorOnly),
        propertyExist(),
        inArray(false),
        valueUniqueness(false),
        arrayUniqueness(false)
    {
    }